

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O1

string * __thiscall
JFSON::(anonymous_namespace)::JsonParser::parse_string_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *out_00;
  byte bVar2;
  byte bVar3;
  string *psVar4;
  size_t sVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  JsonParser *pJVar8;
  undefined8 *puVar9;
  string *psVar10;
  size_type *psVar11;
  ulong uVar12;
  uint uVar13;
  JsonParser *this_00;
  _Alloc_hider _Var14;
  long lVar15;
  bool bVar16;
  string esc;
  string out;
  char buf [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Alloc_hider local_80;
  size_type local_78;
  char local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char local_3c [12];
  
  local_80._M_p = &local_70;
  local_78 = 0;
  local_70 = '\0';
  plVar6 = *this;
  psVar4 = *(string **)((long)this + 8);
  psVar10 = (string *)plVar6[1];
  if (psVar4 != psVar10) {
    paVar1 = &__return_storage_ptr__->field_2;
    this_00 = (JsonParser *)0xffffffffffffffff;
    do {
      out_00 = (string *)((long)&(psVar4->_M_dataplus)._M_p + 1);
      *(string **)((long)this + 8) = out_00;
      lVar15 = *plVar6;
      bVar2 = *(byte *)((long)&(psVar4->_M_dataplus)._M_p + lVar15);
      if (bVar2 == 0x22) {
        anon_unknown_22::JsonParser::encode_utf8(this_00,(long)&local_80,out_00);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
        if (local_80._M_p == &local_70) {
          paVar1->_M_allocated_capacity = CONCAT71(uStack_6f,local_70);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_68;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_80._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_6f,local_70);
        }
        __return_storage_ptr__->_M_string_length = local_78;
        local_78 = 0;
        local_70 = '\0';
        local_80._M_p = &local_70;
LAB_00106ba2:
        lVar15 = 1;
      }
      else {
        if (bVar2 < 0x20) {
          snprintf(local_3c,0xc,"(%d)",(ulong)bVar2);
          local_60[0] = &local_50;
          sVar5 = strlen(local_3c);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_60,local_3c,local_3c + sVar5);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x109591);
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          psVar11 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_a0.field_2._M_allocated_capacity = *psVar11;
            local_a0.field_2._8_8_ = plVar6[3];
          }
          else {
            local_a0.field_2._M_allocated_capacity = *psVar11;
            local_a0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_a0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          psVar11 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_c0.field_2._M_allocated_capacity = *psVar11;
            local_c0.field_2._8_4_ = (undefined4)plVar6[3];
            local_c0.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
          }
          else {
            local_c0.field_2._M_allocated_capacity = *psVar11;
            local_c0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_c0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if (*(char *)((long)this + 0x18) == '\0') {
            std::__cxx11::string::operator=(*(string **)((long)this + 0x10),(string *)&local_c0);
          }
          *(undefined1 *)((long)this + 0x18) = 1;
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          paVar7 = &local_50;
          _Var14._M_p = (pointer)local_60[0];
LAB_00106b98:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var14._M_p != paVar7) {
            operator_delete(_Var14._M_p);
          }
          goto LAB_00106ba2;
        }
        if (bVar2 == 0x5c) {
          if (out_00 == psVar10) {
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,"unexpected end of input in string","");
            if (*(char *)((long)this + 0x18) == '\0') {
              std::__cxx11::string::operator=(*(string **)((long)this + 0x10),(string *)&local_c0);
            }
            *(undefined1 *)((long)this + 0x18) = 1;
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
            paVar7 = &local_c0.field_2;
            _Var14._M_p = local_c0._M_dataplus._M_p;
            goto LAB_00106b98;
          }
          psVar10 = (string *)((long)&(psVar4->_M_dataplus)._M_p + 2);
          *(string **)((long)this + 8) = psVar10;
          bVar2 = *(byte *)((long)&(psVar4->_M_dataplus)._M_p + lVar15 + 1);
          if ((int)(char)bVar2 == 0x75) {
            std::__cxx11::string::substr((ulong)&local_c0,(ulong)plVar6);
            if (local_c0._M_string_length < 4) {
              std::operator+(&local_a0,"bad \\u escape: ",&local_c0);
              if (*(char *)((long)this + 0x18) == '\0') {
                std::__cxx11::string::operator=(*(string **)((long)this + 0x10),(string *)&local_a0)
                ;
              }
              *(undefined1 *)((long)this + 0x18) = 1;
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p);
              }
              lVar15 = 1;
            }
            else {
              bVar16 = false;
              uVar12 = 0;
              do {
                if ((9 < (byte)(local_c0._M_dataplus._M_p[uVar12] - 0x30U)) &&
                   ((uVar13 = (byte)local_c0._M_dataplus._M_p[uVar12] - 0x41, 0x25 < uVar13 ||
                    ((0x3f0000003fU >> ((ulong)uVar13 & 0x3f) & 1) == 0)))) {
                  std::operator+(&local_a0,"bad \\u escape: ",&local_c0);
                  if (*(char *)((long)this + 0x18) == '\0') {
                    std::__cxx11::string::operator=
                              (*(string **)((long)this + 0x10),(string *)&local_a0);
                  }
                  *(undefined1 *)((long)this + 0x18) = 1;
                  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                    operator_delete(local_a0._M_dataplus._M_p);
                  }
                  lVar15 = 1;
                  goto LAB_00106d2a;
                }
                bVar16 = 2 < uVar12;
                uVar12 = uVar12 + 1;
              } while (uVar12 != 4);
              lVar15 = 4;
LAB_00106d2a:
              if (bVar16) {
                pJVar8 = (JsonParser *)strtol(local_c0._M_dataplus._M_p,(char **)0x0,0x10);
                if (((ulong)pJVar8 & 0xfffffffffffffc00) == 0xdc00 &&
                    ((ulong)this_00 & 0xfffffffffffffc00) == 0xd800) {
                  anon_unknown_22::JsonParser::encode_utf8
                            (pJVar8 + (long)this_00 * 0x20 + -0x1afee0,(long)&local_80,
                             (string *)0xfffffffffffffc00);
                  this_00 = (JsonParser *)0xffffffffffffffff;
                }
                else {
                  anon_unknown_22::JsonParser::encode_utf8
                            (this_00,(long)&local_80,(string *)0xfffffffffffffc00);
                  this_00 = pJVar8;
                }
                *(long *)((long)this + 8) = *(long *)((long)this + 8) + 4;
                lVar15 = 0;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p);
            }
          }
          else {
            anon_unknown_22::JsonParser::encode_utf8(this_00,(long)&local_80,psVar10);
            bVar3 = (byte)(bVar2 + 0x9e) >> 1 | bVar2 * -0x80;
            if ((9 < bVar3) || ((0x345U >> (bVar3 & 0x1f) & 1) == 0)) {
              uVar13 = (uint)bVar2;
              if ((0x3a < uVar13 - 0x22) ||
                 ((0x400000000002001U >> ((ulong)(uVar13 - 0x22) & 0x3f) & 1) == 0)) {
                if ((char)bVar2 < ' ') {
                  snprintf((char *)local_60,0xc,"(%d)",(ulong)(uint)(int)(char)bVar2);
                }
                else {
                  snprintf((char *)local_60,0xc,"\'%c\' (%d)",(ulong)uVar13,(ulong)uVar13);
                }
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                sVar5 = strlen((char *)local_60);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_a0,local_60,(long)local_60 + sVar5);
                puVar9 = (undefined8 *)
                         std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x1095ac);
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                psVar11 = puVar9 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_c0.field_2._M_allocated_capacity = *psVar11;
                  local_c0.field_2._8_4_ = *(undefined4 *)(puVar9 + 3);
                  local_c0.field_2._12_4_ = *(undefined4 *)((long)puVar9 + 0x1c);
                }
                else {
                  local_c0.field_2._M_allocated_capacity = *psVar11;
                  local_c0._M_dataplus._M_p = (pointer)*puVar9;
                }
                local_c0._M_string_length = puVar9[1];
                *puVar9 = psVar11;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                if (*(char *)((long)this + 0x18) == '\0') {
                  std::__cxx11::string::operator=
                            (*(string **)((long)this + 0x10),(string *)&local_c0);
                }
                *(undefined1 *)((long)this + 0x18) = 1;
                (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"")
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                  operator_delete(local_c0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p);
                }
                this_00 = (JsonParser *)0xffffffffffffffff;
                goto LAB_00106ba2;
              }
            }
            std::__cxx11::string::push_back((char)&local_80);
            this_00 = (JsonParser *)0xffffffffffffffff;
            lVar15 = 0;
          }
        }
        else {
          anon_unknown_22::JsonParser::encode_utf8(this_00,(long)&local_80,out_00);
          std::__cxx11::string::push_back((char)&local_80);
          this_00 = (JsonParser *)0xffffffffffffffff;
          lVar15 = 0;
        }
      }
      if (lVar15 != 0) goto LAB_001068e4;
      plVar6 = *this;
      psVar4 = *(string **)((long)this + 8);
      psVar10 = (string *)plVar6[1];
    } while (psVar4 != psVar10);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"unexpected end of input in string","");
  if (*(char *)((long)this + 0x18) == '\0') {
    std::__cxx11::string::operator=(*(string **)((long)this + 0x10),(string *)&local_c0);
  }
  *(undefined1 *)((long)this + 0x18) = 1;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
LAB_001068e4:
  if (local_80._M_p != &local_70) {
    operator_delete(local_80._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string parse_string() {
        string out;
        long last_escaped_codepoint = -1;
        while (true) {
            if (i == str.size())
                return fail("unexpected end of input in string", "");

            char ch = str[i++];

            if (ch == '"') {
                encode_utf8(last_escaped_codepoint, out);
                return out;
            }

            if (in_range(ch, 0, 0x1f))
                return fail("unescaped " + esc(ch) + " in string", "");

            // The usual case: non-escaped characters
            if (ch != '\\') {
                encode_utf8(last_escaped_codepoint, out);
                last_escaped_codepoint = -1;
                out += ch;
                continue;
            }

            // Handle escapes
            if (i == str.size())
                return fail("unexpected end of input in string", "");

            ch = str[i++];

            if (ch == 'u') {
                // Extract 4-byte escape sequence
                string esc = str.substr(i, 4);
                // Explicitly check length of the substring. The following loop
                // relies on std::string returning the terminating NUL when
                // accessing str[length]. Checking here reduces brittleness.
                if (esc.length() < 4) {
                    return fail("bad \\u escape: " + esc, "");
                }
                for (size_t j = 0; j < 4; j++) {
                    if (!in_range(esc[j], 'a', 'f') && !in_range(esc[j], 'A', 'F')
                            && !in_range(esc[j], '0', '9'))
                        return fail("bad \\u escape: " + esc, "");
                }

                long codepoint = strtol(esc.data(), nullptr, 16);

                // JSON specifies that characters outside the BMP shall be encoded as a pair
                // of 4-hex-digit \u escapes encoding their surrogate pair components. Check
                // whether we're in the middle of such a beast: the previous codepoint was an
                // escaped lead (high) surrogate, and this is a trail (low) surrogate.
                if (in_range(last_escaped_codepoint, 0xD800, 0xDBFF)
                        && in_range(codepoint, 0xDC00, 0xDFFF)) {
                    // Reassemble the two surrogate pairs into one astral-plane character, per
                    // the UTF-16 algorithm.
                    encode_utf8((((last_escaped_codepoint - 0xD800) << 10)
                                 | (codepoint - 0xDC00)) + 0x10000, out);
                    last_escaped_codepoint = -1;
                } else {
                    encode_utf8(last_escaped_codepoint, out);
                    last_escaped_codepoint = codepoint;
                }

                i += 4;
                continue;
            }

            encode_utf8(last_escaped_codepoint, out);
            last_escaped_codepoint = -1;

            if (ch == 'b') {
                out += '\b';
            } else if (ch == 'f') {
                out += '\f';
            } else if (ch == 'n') {
                out += '\n';
            } else if (ch == 'r') {
                out += '\r';
            } else if (ch == 't') {
                out += '\t';
            } else if (ch == '"' || ch == '\\' || ch == '/') {
                out += ch;
            } else {
                return fail("invalid escape character " + esc(ch), "");
            }
        }
    }